

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O2

void __thiscall
mp::internal::NLFileReader<fmt::File>::Read
          (NLFileReader<fmt::File> *this,MemoryBuffer<char,_1UL,_std::allocator<char>_> *array)

{
  ulong uVar1;
  char *pcVar2;
  ssize_t sVar3;
  size_t in_RCX;
  ulong uVar4;
  
  fmt::Buffer<char>::resize(&array->super_Buffer<char>,this->size_ + 1);
  uVar4 = 0;
  while( true ) {
    uVar1 = this->size_;
    pcVar2 = (array->super_Buffer<char>).ptr_;
    if (uVar1 < uVar4 || (void *)(uVar1 - uVar4) == (void *)0x0) break;
    sVar3 = fmt::File::read(&this->file_,(int)pcVar2 + (int)uVar4,(void *)(uVar1 - uVar4),in_RCX);
    uVar4 = uVar4 + sVar3;
  }
  pcVar2[uVar1] = '\0';
  return;
}

Assistant:

void mp::internal::NLFileReader<File>::Read(
    fmt::internal::MemoryBuffer<char, 1> &array) {
  array.resize(size_ + 1);
  std::size_t offset = 0;
  while (offset < size_)
    offset += file_.read(&array[offset], size_ - offset);
  array[size_] = 0;
}